

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnPool.h
# Opt level: O1

void __thiscall HttpConnPool::start(HttpConnPool *this)

{
  size_t *psVar1;
  element_type *peVar2;
  HttpConn *this_00;
  _List_node_base *p_Var3;
  int iVar4;
  _List_node_base *local_40;
  HttpConnPtr hc;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  this->started_ = true;
  if (0 < this->connNum_) {
    iVar4 = 0;
    do {
      this_00 = (HttpConn *)operator_new(0x188);
      HttpConn::HttpConn(this_00,this->server_,-1);
      std::__shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpConn,void>
                ((__shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2> *)&local_40,this_00);
      p_Var3 = (_List_node_base *)operator_new(0x20);
      peVar2 = hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3[1]._M_next = local_40;
      p_Var3[1]._M_prev = (_List_node_base *)0x0;
      hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      p_Var3[1]._M_prev = (_List_node_base *)peVar2;
      local_40 = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->freeConnPool_).
                super__List_base<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   hc.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->connNum_);
  }
  return;
}

Assistant:

void start() {
       baseLoop_->assertInLoopThread();
       started_ = true;
       for (int i = 0; i < connNum_; ++i) {
           HttpConnPtr hc(new HttpConn(server_, -1));
           freeConnPool_.push_back(std::move(hc));
       }
    }